

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::throwExceptionWithDetail
          (TestMoreStuffImpl *this,ThrowExceptionWithDetailContext context)

{
  char (*in_RCX) [15];
  ArrayPtr<const_unsigned_char> content;
  Array<unsigned_char> local_1e0;
  String local_1c8;
  undefined1 local_1b0 [8];
  Exception e;
  TestMoreStuffImpl *this_local;
  ThrowExceptionWithDetailContext context_local;
  
  e.details.builder.disposer = (ArrayDisposer *)context.hook;
  kj::_::Debug::makeDescription<char_const(&)[15]>
            (&local_1c8,(Debug *)"\"test exception\"","test exception",in_RCX);
  kj::Exception::Exception
            ((Exception *)local_1b0,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x4c4,&local_1c8);
  kj::String::~String(&local_1c8);
  content = operator___kjb<kj::_::ByteLiteral<4UL>__102,_111,_111__>();
  kj::heapArray<unsigned_char>(&local_1e0,content);
  kj::Exception::setDetail((Exception *)local_1b0,1,&local_1e0);
  kj::Array<unsigned_char>::~Array(&local_1e0);
  kj::Promise<void>::Promise((Promise<void> *)this,(Exception *)local_1b0);
  kj::Exception::~Exception((Exception *)local_1b0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::throwExceptionWithDetail(
    ThrowExceptionWithDetailContext context) {
  auto e = KJ_EXCEPTION(FAILED, "test exception");
  e.setDetail(1, kj::heapArray<byte>("foo"_kjb));
  return e;
}